

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_monitor.cpp
# Opt level: O0

void __thiscall
r_exec::SRMonitor::SRMonitor
          (SRMonitor *this,PrimaryMDLController *controller,BindingMap *bindings,uint64_t sim_thz,
          Fact *goal,Fact *f_imdl)

{
  MonitoringJob<r_exec::SRMonitor> *this_00;
  _Mem *this_01;
  MonitoringJob<r_exec::SRMonitor> *j;
  Fact *f_imdl_local;
  Fact *goal_local;
  uint64_t sim_thz_local;
  BindingMap *bindings_local;
  PrimaryMDLController *controller_local;
  SRMonitor *this_local;
  
  SGMonitor::SGMonitor(&this->super_SGMonitor,controller,bindings,sim_thz,goal,f_imdl);
  (this->super_SGMonitor).super__GMonitor.super_Monitor.super__Object._vptr__Object =
       (_func_int **)&PTR__SRMonitor_002eb948;
  this_00 = (MonitoringJob<r_exec::SRMonitor> *)operator_new(0x28);
  MonitoringJob<r_exec::SRMonitor>::MonitoringJob(this_00,this,sim_thz);
  this_01 = _Mem::Get();
  _Mem::pushTimeJob(this_01,(TimeJob *)this_00);
  return;
}

Assistant:

SRMonitor::SRMonitor(PrimaryMDLController *controller,
                     BindingMap *bindings,
                     uint64_t sim_thz,
                     Fact *goal,
                     Fact *f_imdl): SGMonitor(controller,
                                 bindings,
                                 sim_thz,
                                 goal,
                                 f_imdl)   // goal is f0->g->f1->object.
{
    MonitoringJob<SRMonitor> *j = new MonitoringJob<SRMonitor>(this, sim_thz);
    _Mem::Get()->pushTimeJob(j);
}